

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wl_window.c
# Opt level: O0

void keyboardHandleEnter(void *userData,wl_keyboard *keyboard,uint32_t serial,wl_surface *surface,
                        wl_array *keys)

{
  char **ppcVar1;
  _GLFWwindow *window_00;
  _GLFWwindow *window;
  wl_array *keys_local;
  wl_surface *surface_local;
  uint32_t serial_local;
  wl_keyboard *keyboard_local;
  void *userData_local;
  
  if (((surface != (wl_surface *)0x0) &&
      (ppcVar1 = (*_glfw.wl.client.proxy_get_tag)((wl_proxy *)surface), ppcVar1 == (char **)0x18e040
      )) && (window_00 = (_GLFWwindow *)wl_surface_get_user_data(surface),
            surface == (window_00->wl).surface)) {
    _glfw.wl.serial = serial;
    _glfw.wl.keyboardFocus = window_00;
    _glfwInputWindowFocus(window_00,1);
  }
  return;
}

Assistant:

static void keyboardHandleEnter(void* userData,
                                struct wl_keyboard* keyboard,
                                uint32_t serial,
                                struct wl_surface* surface,
                                struct wl_array* keys)
{
    // Happens in the case we just destroyed the surface.
    if (!surface)
        return;

    if (wl_proxy_get_tag((struct wl_proxy*) surface) != &_glfw.wl.tag)
        return;

    _GLFWwindow* window = wl_surface_get_user_data(surface);
    if (surface != window->wl.surface)
        return;

    _glfw.wl.serial = serial;
    _glfw.wl.keyboardFocus = window;
    _glfwInputWindowFocus(window, GLFW_TRUE);
}